

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O2

void __thiscall amrex::StateData::syncNewTimeLevel(StateData *this,Real time)

{
  double dVar1;
  TimeCenter TVar2;
  double dVar3;
  
  dVar1 = (this->new_time).stop;
  dVar3 = (dVar1 - (this->old_time).stop) * 0.001;
  if ((dVar1 - dVar3 < time) && (time < dVar1 + dVar3)) {
    TVar2 = StateDescriptor::timeType(this->desc);
    (this->new_time).stop = time;
    if (TVar2 == Point) {
      (this->new_time).start = time;
    }
  }
  return;
}

Assistant:

void
StateData::syncNewTimeLevel (Real time)
{
    Real teps = (new_time.stop - old_time.stop)*1.e-3_rt;
    if (time > new_time.stop-teps && time < new_time.stop+teps)
    {
        if (desc->timeType() == StateDescriptor::Point)
        {
            new_time.start = new_time.stop = time;
        }
        else
        {
            new_time.stop = time;
        }
    }
}